

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O2

bool TestCompressionNoBias8(void)

{
  ostream *poVar1;
  int64_t base;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  uVar2 = 0;
  do {
    if (uVar2 == 0x201) {
LAB_0010138e:
      return 0x200 < uVar2;
    }
    uVar3 = uVar2 & 0xff;
    lVar4 = -0x100000000000000;
    for (lVar8 = -0x101; lVar8 != 0x101; lVar8 = lVar8 + 1) {
      if (-1 < (long)(uVar2 + lVar8)) {
        uVar7 = uVar2 + lVar8 & 0xff;
        uVar5 = uVar7 | (uint)uVar2 & 0x300;
        if ((uint)uVar3 < (uint)uVar7) {
          uVar6 = uVar5 - 0x100;
          bVar9 = uVar7 - uVar3 < 0x80;
        }
        else {
          uVar6 = uVar5 + 0x100;
          bVar9 = uVar3 - uVar7 < 0x81;
        }
        if (bVar9) {
          uVar6 = uVar5;
        }
        if ((lVar4 >> 0x38) + uVar2 != uVar6) {
          poVar1 = std::operator<<((ostream *)&std::cout,
                                   "!! TestCompressionNoBias8 failed: New algorithm does not match reference version for base = "
                                  );
          poVar1 = std::ostream::_M_insert<long>((long)poVar1);
          poVar1 = std::operator<<(poVar1,", offset = ");
          poVar1 = std::ostream::_M_insert<long>((long)poVar1);
          std::endl<char,std::char_traits<char>>(poVar1);
          goto LAB_0010138e;
        }
      }
      lVar4 = lVar4 + 0x100000000000000;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool TestCompressionNoBias8()
{
    for (int64_t base = 0; base < 256 * 2 + 1; ++base)
    {
        for (int64_t offset = -256 - 1; offset < 256 + 1; ++offset)
        {
            const int64_t neighbor = base + offset;
            if (neighbor < 0) {
                continue;
            }

            Counter64 recent = base;
            Counter8 smaller = (uint8_t)neighbor;
            Counter64 reconstructed = Counter64::ExpandFromTruncated(recent, smaller);

            // Compare with reference version
            Counter64 ref_reconstructed = Counter64::ExpandFromTruncatedWithBias(recent, smaller, 0);

            if (reconstructed.ToUnsigned() != ref_reconstructed.ToUnsigned())
            {
                std::cout << "!! TestCompressionNoBias8 failed: New algorithm does not match reference version for base = " << base << ", offset = " << offset << std::endl;

                COUNTER_DEBUG_BREAK();
                return false;
            }
        }
    }

    return true;
}